

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O1

void benchmark::anon_unknown_1::InitializeSystemInfo(void)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  char *pcVar10;
  ssize_t sVar11;
  long lVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar13;
  bool bVar14;
  double dVar15;
  char *err;
  long freq;
  char line [1024];
  char *local_468;
  long local_460;
  ulong local_458;
  long local_450;
  double local_448;
  CheckHandler local_440;
  char local_438 [2];
  undefined6 uStack_436;
  char local_430;
  
  bVar5 = ReadIntFromFile("/sys/devices/system/cpu/cpu0/tsc_freq_khz",&local_450);
  if (bVar5) {
    (anonymous_namespace)::cpuinfo_cycles_per_second = (double)local_450 * 1000.0;
  }
  else {
    bVar6 = ReadIntFromFile("/sys/devices/system/cpu/cpu0/cpufreq/cpuinfo_max_freq",&local_450);
    if (bVar6) {
      (anonymous_namespace)::cpuinfo_cycles_per_second = (double)local_450 * 1000.0;
      bVar5 = true;
    }
  }
  iVar7 = open("/proc/cpuinfo",0);
  if (iVar7 == -1) {
    _GLOBAL__N_1::InitializeSystemInfo((_GLOBAL__N_1 *)(ulong)bVar5);
    iVar7 = (anonymous_namespace)::cpuinfo_num_cpus;
  }
  else {
    local_458 = 0;
    local_438[0] = '\0';
    local_438[1] = 0;
    local_448 = 1.0;
    sVar11 = 0;
    local_460 = 0;
    bVar14 = false;
    bVar6 = false;
    do {
      sVar9 = strlen(local_438);
      if (sVar9 == 0x3ff) {
        local_438[0] = '\0';
      }
      else {
        memmove(local_438,local_438 + sVar9 + 1,0x3ff - sVar9);
      }
      pcVar10 = strchr(local_438,10);
      if (pcVar10 == (char *)0x0) {
        sVar9 = strlen(local_438);
        if (sVar9 - 0x3ff == 0) {
          internal::CheckHandler::CheckHandler
                    (&local_440,"bytes_to_read > 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/sysinfo.cc"
                     ,"InitializeSystemInfo",0x99);
        }
        else {
          internal::GetNullLogInstance();
        }
        if (sVar9 == 0x3ff) {
          internal::CheckHandler::~CheckHandler(&local_440);
        }
        sVar11 = read(iVar7,local_438 + sVar9,-(sVar9 - 0x3ff));
        local_438[sVar11 + sVar9] = '\0';
        pcVar10 = strchr(local_438,10);
      }
      if (pcVar10 != (char *)0x0) {
        *pcVar10 = '\0';
      }
      bVar13 = bVar5;
      bVar4 = bVar14;
      if ((bVar5 == false) && (iVar8 = strncasecmp(local_438,"cpu MHz",7), iVar8 == 0)) {
        pcVar10 = strchr(local_438,0x3a);
        if (pcVar10 != (char *)0x0) {
          dVar15 = strtod(pcVar10 + 1,&local_468);
          (anonymous_namespace)::cpuinfo_cycles_per_second = dVar15 * 1000000.0;
          if (pcVar10[1] != '\0') {
            if (0.0 < (anonymous_namespace)::cpuinfo_cycles_per_second) {
              bVar13 = true;
            }
            if (*local_468 != '\0') {
              bVar13 = bVar5;
            }
          }
        }
      }
      else {
        iVar8 = strncasecmp(local_438,"bogomips",8);
        if (iVar8 == 0) {
          pcVar10 = strchr(local_438,0x3a);
          if (pcVar10 != (char *)0x0) {
            local_448 = strtod(pcVar10 + 1,&local_468);
            local_448 = local_448 * 1000000.0;
            if (pcVar10[1] != '\0') {
              bVar6 = bVar14;
              if (0.0 < local_448) {
                bVar6 = true;
              }
              bVar4 = bVar6;
              if (*local_468 != '\0') {
                bVar6 = bVar14;
                bVar4 = bVar14;
              }
            }
          }
        }
        else if (local_430 == 'r' &&
                 CONCAT62(uStack_436,CONCAT11(local_438[1],local_438[0])) == 0x6f737365636f7270) {
          local_458 = (ulong)((int)local_458 + 1);
          pcVar10 = strchr(local_438,0x3a);
          if ((pcVar10 != (char *)0x0) &&
             (lVar12 = strtol(pcVar10 + 1,&local_468,10), pcVar10[1] != '\0')) {
            if (lVar12 < local_460) {
              lVar12 = local_460;
            }
            if (*local_468 == '\0') {
              local_460 = lVar12;
            }
          }
        }
      }
      bVar14 = bVar4;
      bVar5 = bVar13;
    } while (sVar11 != 0);
    close(iVar7);
    uVar3 = local_458;
    dVar15 = (anonymous_namespace)::cpuinfo_cycles_per_second;
    if ((bVar5 == false) && (dVar15 = local_448, !bVar6)) {
      uVar1 = rdtsc();
      SleepForMilliseconds(1000);
      uVar2 = rdtsc();
      dVar15 = (double)(long)((uVar2 & 0xffffffff00000000 | CONCAT44(extraout_var_00,(int)uVar2)) -
                             (uVar1 & 0xffffffff00000000 | CONCAT44(extraout_var,(int)uVar1)));
    }
    (anonymous_namespace)::cpuinfo_cycles_per_second = dVar15;
    iVar7 = (int)uVar3;
    if (iVar7 == 0) {
      _GLOBAL__N_1::InitializeSystemInfo();
      iVar7 = (anonymous_namespace)::cpuinfo_num_cpus;
    }
    else if (local_460 + 1 != (long)iVar7) {
      _GLOBAL__N_1::InitializeSystemInfo();
    }
  }
  (anonymous_namespace)::cpuinfo_num_cpus = iVar7;
  return;
}

Assistant:

void InitializeSystemInfo() {
#if defined BENCHMARK_OS_LINUX || defined BENCHMARK_OS_CYGWIN
  char line[1024];
  char* err;
  long freq;

  bool saw_mhz = false;

  // If the kernel is exporting the tsc frequency use that. There are issues
  // where cpuinfo_max_freq cannot be relied on because the BIOS may be
  // exporintg an invalid p-state (on x86) or p-states may be used to put the
  // processor in a new mode (turbo mode). Essentially, those frequencies
  // cannot always be relied upon. The same reasons apply to /proc/cpuinfo as
  // well.
  if (!saw_mhz &&
      ReadIntFromFile("/sys/devices/system/cpu/cpu0/tsc_freq_khz", &freq)) {
    // The value is in kHz (as the file name suggests).  For example, on a
    // 2GHz warpstation, the file contains the value "2000000".
    cpuinfo_cycles_per_second = freq * 1000.0;
    saw_mhz = true;
  }

  // If CPU scaling is in effect, we want to use the *maximum* frequency,
  // not whatever CPU speed some random processor happens to be using now.
  if (!saw_mhz &&
      ReadIntFromFile("/sys/devices/system/cpu/cpu0/cpufreq/cpuinfo_max_freq",
                      &freq)) {
    // The value is in kHz.  For example, on a 2GHz warpstation, the file
    // contains the value "2000000".
    cpuinfo_cycles_per_second = freq * 1000.0;
    saw_mhz = true;
  }

  // Read /proc/cpuinfo for other values, and if there is no cpuinfo_max_freq.
  const char* pname = "/proc/cpuinfo";
  int fd = open(pname, O_RDONLY);
  if (fd == -1) {
    perror(pname);
    if (!saw_mhz) {
      cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());
    }
    return;
  }

  double bogo_clock = 1.0;
  bool saw_bogo = false;
  long max_cpu_id = 0;
  int num_cpus = 0;
  line[0] = line[1] = '\0';
  size_t chars_read = 0;
  do {  // we'll exit when the last read didn't read anything
    // Move the next line to the beginning of the buffer
    const size_t oldlinelen = strlen(line);
    if (sizeof(line) == oldlinelen + 1)  // oldlinelen took up entire line
      line[0] = '\0';
    else  // still other lines left to save
      memmove(line, line + oldlinelen + 1, sizeof(line) - (oldlinelen + 1));
    // Terminate the new line, reading more if we can't find the newline
    char* newline = strchr(line, '\n');
    if (newline == nullptr) {
      const size_t linelen = strlen(line);
      const size_t bytes_to_read = sizeof(line) - 1 - linelen;
      CHECK(bytes_to_read > 0);  // because the memmove recovered >=1 bytes
      chars_read = read(fd, line + linelen, bytes_to_read);
      line[linelen + chars_read] = '\0';
      newline = strchr(line, '\n');
    }
    if (newline != nullptr) *newline = '\0';

    // When parsing the "cpu MHz" and "bogomips" (fallback) entries, we only
    // accept postive values. Some environments (virtual machines) report zero,
    // which would cause infinite looping in WallTime_Init.
    if (!saw_mhz && strncasecmp(line, "cpu MHz", sizeof("cpu MHz") - 1) == 0) {
      const char* freqstr = strchr(line, ':');
      if (freqstr) {
        cpuinfo_cycles_per_second = strtod(freqstr + 1, &err) * 1000000.0;
        if (freqstr[1] != '\0' && *err == '\0' && cpuinfo_cycles_per_second > 0)
          saw_mhz = true;
      }
    } else if (strncasecmp(line, "bogomips", sizeof("bogomips") - 1) == 0) {
      const char* freqstr = strchr(line, ':');
      if (freqstr) {
        bogo_clock = strtod(freqstr + 1, &err) * 1000000.0;
        if (freqstr[1] != '\0' && *err == '\0' && bogo_clock > 0)
          saw_bogo = true;
      }
    } else if (strncmp(line, "processor", sizeof("processor") - 1) == 0) {
      // The above comparison is case-sensitive because ARM kernels often
      // include a "Processor" line that tells you about the CPU, distinct
      // from the usual "processor" lines that give you CPU ids. No current
      // Linux architecture is using "Processor" for CPU ids.
      num_cpus++;  // count up every time we see an "processor :" entry
      const char* id_str = strchr(line, ':');
      if (id_str) {
        const long cpu_id = strtol(id_str + 1, &err, 10);
        if (id_str[1] != '\0' && *err == '\0' && max_cpu_id < cpu_id)
          max_cpu_id = cpu_id;
      }
    }
  } while (chars_read > 0);
  close(fd);

  if (!saw_mhz) {
    if (saw_bogo) {
      // If we didn't find anything better, we'll use bogomips, but
      // we're not happy about it.
      cpuinfo_cycles_per_second = bogo_clock;
    } else {
      // If we don't even have bogomips, we'll use the slow estimation.
      cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());
    }
  }
  if (num_cpus == 0) {
    fprintf(stderr, "Failed to read num. CPUs correctly from /proc/cpuinfo\n");
  } else {
    if ((max_cpu_id + 1) != num_cpus) {
      fprintf(stderr,
              "CPU ID assignments in /proc/cpuinfo seem messed up."
              " This is usually caused by a bad BIOS.\n");
    }
    cpuinfo_num_cpus = num_cpus;
  }

#elif defined BENCHMARK_OS_FREEBSD
// For this sysctl to work, the machine must be configured without
// SMP, APIC, or APM support.  hz should be 64-bit in freebsd 7.0
// and later.  Before that, it's a 32-bit quantity (and gives the
// wrong answer on machines faster than 2^32 Hz).  See
//  http://lists.freebsd.org/pipermail/freebsd-i386/2004-November/001846.html
// But also compare FreeBSD 7.0:
//  http://fxr.watson.org/fxr/source/i386/i386/tsc.c?v=RELENG70#L223
//  231         error = sysctl_handle_quad(oidp, &freq, 0, req);
// To FreeBSD 6.3 (it's the same in 6-STABLE):
//  http://fxr.watson.org/fxr/source/i386/i386/tsc.c?v=RELENG6#L131
//  139         error = sysctl_handle_int(oidp, &freq, sizeof(freq), req);
#if __FreeBSD__ >= 7
  uint64_t hz = 0;
#else
  unsigned int hz = 0;
#endif
  size_t sz = sizeof(hz);
  const char* sysctl_path = "machdep.tsc_freq";
  if (sysctlbyname(sysctl_path, &hz, &sz, nullptr, 0) != 0) {
    fprintf(stderr, "Unable to determine clock rate from sysctl: %s: %s\n",
            sysctl_path, strerror(errno));
    cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());
  } else {
    cpuinfo_cycles_per_second = hz;
  }
// TODO: also figure out cpuinfo_num_cpus


#elif defined BENCHMARK_OS_WINDOWS
  // In NT, read MHz from the registry. If we fail to do so or we're in win9x
  // then make a crude estimate.
  DWORD data, data_size = sizeof(data);
  if (IsWindowsXPOrGreater() &&
      SUCCEEDED(
          SHGetValueA(HKEY_LOCAL_MACHINE,
                      "HARDWARE\\DESCRIPTION\\System\\CentralProcessor\\0",
                      "~MHz", nullptr, &data, &data_size)))
    cpuinfo_cycles_per_second = static_cast<double>((int64_t)data * (int64_t)(1000 * 1000));  // was mhz
  else
    cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());

  SYSTEM_INFO sysinfo;
  // Use memset as opposed to = {} to avoid GCC missing initializer false positives.
  std::memset(&sysinfo, 0, sizeof(SYSTEM_INFO));
  GetSystemInfo(&sysinfo);
  cpuinfo_num_cpus = sysinfo.dwNumberOfProcessors; // number of logical processors in the current group

#elif defined BENCHMARK_OS_MACOSX
  // returning "mach time units" per second. the current number of elapsed
  // mach time units can be found by calling uint64 mach_absolute_time();
  // while not as precise as actual CPU cycles, it is accurate in the face
  // of CPU frequency scaling and multi-cpu/core machines.
  // Our mac users have these types of machines, and accuracy
  // (i.e. correctness) trumps precision.
  // See cycleclock.h: CycleClock::Now(), which returns number of mach time
  // units on Mac OS X.
  mach_timebase_info_data_t timebase_info;
  mach_timebase_info(&timebase_info);
  double mach_time_units_per_nanosecond =
      static_cast<double>(timebase_info.denom) /
      static_cast<double>(timebase_info.numer);
  cpuinfo_cycles_per_second = mach_time_units_per_nanosecond * 1e9;

  int num_cpus = 0;
  size_t size = sizeof(num_cpus);
  int numcpus_name[] = {CTL_HW, HW_NCPU};
  if (::sysctl(numcpus_name, arraysize(numcpus_name), &num_cpus, &size, nullptr, 0) ==
          0 &&
      (size == sizeof(num_cpus)))
    cpuinfo_num_cpus = num_cpus;

#else
  // Generic cycles per second counter
  cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());
#endif
}